

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O1

cmFileSetVisibility cmFileSetVisibilityFromName(string_view name,cmMakefile *mf)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  __s1 = name._M_str;
  sVar2 = name._M_len;
  if (sVar2 == 6) {
    iVar1 = bcmp(__s1,"PUBLIC",6);
    if (iVar1 == 0) {
      return Public;
    }
  }
  else if (sVar2 == 7) {
    iVar1 = bcmp(__s1,"PRIVATE",7);
    if (iVar1 == 0) {
      return Private;
    }
  }
  else if ((sVar2 == 9) && (iVar1 = bcmp(__s1,"INTERFACE",9), iVar1 == 0)) {
    return Interface;
  }
  local_48._M_len = 0x15;
  local_48._M_str = "File set visibility \"";
  local_28 = 0xf;
  local_20 = "\" is not valid.";
  views._M_len = 3;
  views._M_array = &local_48;
  local_38 = sVar2;
  local_30 = __s1;
  cmCatViews_abi_cxx11_(&local_68,views);
  if (mf == (cmMakefile *)0x0) {
    cmSystemTools::Error(&local_68);
  }
  else {
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return Private;
}

Assistant:

cmFileSetVisibility cmFileSetVisibilityFromName(cm::string_view name,
                                                cmMakefile* mf)
{
  if (name == "INTERFACE"_s) {
    return cmFileSetVisibility::Interface;
  }
  if (name == "PUBLIC"_s) {
    return cmFileSetVisibility::Public;
  }
  if (name == "PRIVATE"_s) {
    return cmFileSetVisibility::Private;
  }
  auto msg = cmStrCat("File set visibility \"", name, "\" is not valid.");
  if (mf) {
    mf->IssueMessage(MessageType::FATAL_ERROR, msg);
  } else {
    cmSystemTools::Error(msg);
  }
  return cmFileSetVisibility::Private;
}